

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O3

size_t __thiscall nuraft::FakeTimer::getNumPendingTasks(FakeTimer *this,int type)

{
  _List_node_base *p_Var1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->tasksLock);
  if (iVar2 == 0) {
    if (type < 0) {
      sVar3 = (this->tasks).
              super__List_base<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
              ._M_impl._M_node._M_size;
    }
    else {
      sVar3 = 0;
      for (p_Var1 = (this->tasks).
                    super__List_base<std::shared_ptr<nuraft::delayed_task>,_std::allocator<std::shared_ptr<nuraft::delayed_task>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var1 != (_List_node_base *)&this->tasks; p_Var1 = p_Var1->_M_next) {
        sVar3 = sVar3 + (*(int *)((long)(p_Var1[1]._M_next + 3) + 8) == type);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->tasksLock);
    return sVar3;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

size_t FakeTimer::getNumPendingTasks(int type) {
    std::lock_guard<std::mutex> l(tasksLock);

    if (type < 0) {
        // Count all.
        return tasks.size();
    }

    size_t count = 0;
    for (auto& entry: tasks) {
        ptr<delayed_task>& cur_task = entry;
        if (cur_task->get_type() == type) count++;
    }
    return count;
}